

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

int32_t rtosc_convert_to_range
                  (rtosc_arg_val_t *arg,size_t size,rtosc_arg_val_t *arg_out,
                  rtosc_print_options *opt)

{
  rtosc_arg_val_t *arg_00;
  char cVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  rtosc_arg_val_t *prVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  rtosc_arg_val_t delta;
  rtosc_arg_val_t added;
  rtosc_arg_val_t local_60;
  rtosc_arg_val_t local_48;
  
  uVar10 = 0;
  if (((size < 5) || (cVar1 = arg->type, cVar1 == '-')) || (opt->compress_ranges == 0))
  goto LAB_0010d0ec;
  uVar10 = 0;
  uVar11 = 0;
  do {
    if (cVar1 != arg[uVar10].type) break;
    lVar7 = 1;
    if (arg[uVar10].type == 'a') {
      iVar3 = rtosc_av_arr_len(arg + uVar10);
      lVar7 = (long)(iVar3 + 1);
    }
    uVar10 = uVar10 + lVar7;
    uVar11 = uVar11 + 1;
  } while (uVar10 < size);
  uVar10 = 0;
  if (uVar11 < 5) goto LAB_0010d0ec;
  lVar7 = 1;
  if (arg->type == 'a') {
    iVar3 = rtosc_av_arr_len(arg);
    lVar7 = (long)(iVar3 + 1);
  }
  lVar9 = 0;
  iVar4 = rtosc_arg_vals_eq_single(arg,arg + lVar7,(rtosc_cmp_options *)0x0);
  if (iVar4 == 0) {
    pvVar6 = memchr("cihTF",(int)arg->type,6);
    if (pvVar6 != (void *)0x0) {
      rtosc_arg_val_sub(arg + 1,arg,&local_60);
      lVar9 = 1;
      goto LAB_0010cfbf;
    }
  }
  else {
LAB_0010cfbf:
    uVar11 = 1;
    uVar10 = 1;
    if (arg->type == 'a') {
      iVar3 = rtosc_av_arr_len(arg);
      uVar10 = (ulong)(iVar3 + 1);
    }
    prVar8 = arg;
    if (iVar4 == 0) {
      prVar8 = &local_48;
    }
    do {
      arg_00 = arg + (int)uVar10;
      lVar7 = 1;
      if (arg_00->type == 'a') {
        iVar3 = rtosc_av_arr_len(arg_00);
        lVar7 = (long)(iVar3 + 1);
      }
      if (iVar4 == 0) {
        rtosc_arg_val_add(arg_00,&local_60,&local_48);
      }
      uVar10 = lVar7 + (int)uVar10;
      if (uVar10 < size) {
        bVar2 = false;
        iVar5 = rtosc_arg_vals_eq_single(prVar8,arg + uVar10,(rtosc_cmp_options *)0x0);
        if (iVar5 == 0) goto LAB_0010d064;
      }
      else {
LAB_0010d064:
        bVar2 = true;
      }
      uVar11 = uVar11 + 1;
    } while (!bVar2);
    if (4 < uVar11) {
      insert_arg_range(arg_out,(int32_t)uVar11,arg,(int)lVar9,&local_60,0,0);
      lVar7 = 1;
      if (arg->type == 'a') {
        iVar3 = rtosc_av_arr_len(arg);
        lVar7 = (long)(iVar3 + 1);
      }
      prVar8 = arg_out + lVar9 + lVar7 + 1;
      prVar8->type = ' ';
      rtosc_av_arr_len_set
                (prVar8,(int)((ulong)((long)prVar8 - (long)arg_out) >> 3) * 0x55555555 + (int)uVar10
                        + -1);
      goto LAB_0010d0ec;
    }
  }
  uVar10 = 0;
LAB_0010d0ec:
  return (int32_t)uVar10;
}

Assistant:

static int32_t rtosc_convert_to_range(const rtosc_arg_val_t* const arg,
                                      size_t size,
                                      rtosc_arg_val_t* arg_out,
                                      const rtosc_print_options* opt)
{
    if(size < range_min || arg[0].type == '-' || !opt->compress_ranges)
        return 0;
    char type = arg->type;
    size_t num_common = 0;
    for(size_t i = 0; i < size; i += incsize(arg+i), ++num_common)
    {
        if(type != arg[i].type)
            break;
    }
    if(num_common < range_min)
        return 0;

    int32_t skipped;
    num_common = 1;
    int has_delta;
    rtosc_arg_val_t delta, added;

    if(rtosc_arg_vals_eq_single(arg, arg + incsize(arg), NULL))
        has_delta = 0;
    else if(strchr(numeric_range_convertible_types(), arg->type)) {
        has_delta = 1;
        rtosc_arg_val_sub(arg+1, arg, &delta);
    }
    else return 0;

    {
        int go_on = 1;
        size_t next;
        for(skipped = incsize(arg); go_on; skipped = next, ++num_common)
        {
            next = skipped + incsize(arg+skipped);

            if(has_delta)
                rtosc_arg_val_add(arg+skipped, &delta, &added);

            if(next >= size || !rtosc_arg_vals_eq_single(has_delta ? &added
                                                                   : arg,
                                                         arg+next, NULL))
                go_on = false;
        }
    }

    if(num_common >= range_min)
    {
        insert_arg_range(arg_out, num_common, arg, has_delta, &delta,
                         false, false);
        const rtosc_arg_val_t* old_arg_out = arg_out;
        arg_out += 1 + has_delta;
        arg_out += incsize(arg);
        arg_out->type = ' ';
        rtosc_av_arr_len_set(arg_out, skipped - (arg_out - old_arg_out) - 1);
        return skipped;
    }
    else
        return 0;
}